

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msocket_adt.c
# Opt level: O1

msocket_adt_error_t msocket_bytearray_trimLeft(msocket_bytearray_t *self,uint8_t *pSrc)

{
  uint uVar1;
  uint8_t *__dest;
  msocket_adt_error_t mVar2;
  uint uVar3;
  uint32_t uVar4;
  
  mVar2 = '\x01';
  if (((pSrc != (uint8_t *)0x0 && self != (msocket_bytearray_t *)0x0) &&
      (__dest = self->pData, __dest <= pSrc)) && (uVar1 = self->u32CurLen, pSrc <= __dest + uVar1))
  {
    uVar3 = (int)pSrc - (int)__dest;
    if (pSrc == __dest) {
      if (uVar3 != 0) {
        __assert_fail("start == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/msocket/src/msocket_adt.c"
                      ,0x75,
                      "msocket_adt_error_t msocket_bytearray_trimLeft(msocket_bytearray_t *, const uint8_t *)"
                     );
      }
    }
    else {
      uVar4 = 0;
      if (uVar1 != uVar3) {
        uVar4 = uVar1 - uVar3;
        memmove(__dest,pSrc,(ulong)uVar4);
      }
      self->u32CurLen = uVar4;
    }
    mVar2 = '\0';
  }
  return mVar2;
}

Assistant:

msocket_adt_error_t msocket_bytearray_trimLeft(msocket_bytearray_t *self, const uint8_t *pSrc){
   if( (self!=0) && (pSrc!=0) && (self->pData <= pSrc) && (pSrc <= self->pData + self->u32CurLen) ){
      uint32_t start, remain;
      /*
       * boundary cases:
       *    pBegin = self->pData
       *    =>
       *       start = 0
       *       remain = self->u32CurLen
       *
       *    pBegin = self->pData+self->u32CurLen
       *    =>
       *       start = self->u32CurLen
       *       remain = 0
       */
      start = (uint32_t) (pSrc - self->pData);
      remain = self->u32CurLen - start;
      if(pSrc == self->pData){
         //no action
         assert(start == 0);
      }
      else if(remain == 0){
         //remove all
         self->u32CurLen = 0;
      }
      else{
         memmove(self->pData,pSrc,remain);
         self->u32CurLen = remain;
      }
      return ADT_NO_ERROR;
   }
   return ADT_INVALID_ARGUMENT_ERROR;
}